

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O3

bool __thiscall nuraft::timer_helper::timeout_and_reset(timer_helper *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (this->first_event_fired_ == false) {
    this->first_event_fired_ = true;
  }
  else {
    if (((double)(lVar2 - (this->t_created_).__d.__r) / 1000000000.0) * 1000000.0 <=
        ((double)CONCAT44(0x45300000,(int)(this->duration_us_ >> 0x20)) - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)this->duration_us_) - 4503599627370496.0)) {
      bVar3 = false;
      goto LAB_0019c372;
    }
    (this->t_created_).__d.__r = lVar2;
  }
  bVar3 = true;
LAB_0019c372:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  return bVar3;
}

Assistant:

bool timeout_and_reset() {
        auto cur = std::chrono::system_clock::now();

        std::lock_guard<std::mutex> l(lock_);
        if (!first_event_fired_) {
            // First event, return `true` immediately.
            first_event_fired_ = true;
            return true;
        }

        std::chrono::duration<double> elapsed = cur - t_created_;
        if (duration_us_ < elapsed.count() * 1000000) {
            t_created_ = cur;
            return true;
        }
        return false;
    }